

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_> *this_00;
  Impl *pIVar1;
  Entry *pEVar2;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
  *pRVar3;
  Disposer *pDVar4;
  AnnotatedHandler *pAVar5;
  undefined1 auVar6 [16];
  Disposer *pDVar7;
  Schema SVar8;
  Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> MVar9;
  size_t sVar10;
  Schema handler;
  CapTableReader *unaff_R15;
  Entry *pEVar11;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
  table;
  Type type;
  Maybe<unsigned_long> MVar12;
  Own<capnp::JsonCodec::AnnotatedHandler> newHandler;
  Fault f;
  undefined8 local_b8;
  Schema SStack_b0;
  Disposer *local_a8;
  AnnotatedHandler *pAStack_a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  Fault local_90;
  Maybe<kj::StringPtr> *local_88;
  Vector<capnp::Schema> *local_80;
  ArrayPtr<const_char> local_78;
  Reader local_68;
  
  local_78.size_ = (size_t)local_78.ptr;
  pIVar1 = (this->impl).ptr;
  local_b8 = (Disposer *)&DAT_00000010;
  local_a8 = (Disposer *)0x0;
  pAStack_a0 = (AnnotatedHandler *)0x0;
  pEVar11 = (pIVar1->annotatedHandlers).table.rows.builder.ptr;
  sVar10 = (long)(pIVar1->annotatedHandlers).table.rows.builder.pos - (long)pEVar11 >> 5;
  table.size_ = (size_t)pEVar11;
  table.ptr = (Entry *)&(pIVar1->annotatedHandlers).table.indexes;
  SStack_b0 = schema.super_Schema.raw;
  local_98 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_88 = unionDeclName;
  local_80 = dependencies;
  MVar12 = kj::
           HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           ::
           insert<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,capnp::Type&>
                     ((HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
                       *)&local_68,table,sVar10,(Type *)sVar10);
  pAVar5 = pAStack_a0;
  if (local_68._reader.segment._0_1_ ==
      (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
       )0x1) {
    unaff_R15 = local_68._reader.capTable;
  }
  this_00 = &pIVar1->annotatedHandlers;
  if (local_68._reader.segment._0_1_ ==
      (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
       )0x0) {
    pEVar11 = (pIVar1->annotatedHandlers).table.rows.builder.endPtr;
    if ((pIVar1->annotatedHandlers).table.rows.builder.pos == pEVar11) {
      pEVar2 = (this_00->table).rows.builder.ptr;
      sVar10 = 4;
      if (pEVar11 != pEVar2) {
        sVar10 = (long)pEVar11 - (long)pEVar2 >> 4;
      }
      kj::
      Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
      ::setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
                     *)this_00,sVar10);
    }
    pDVar7 = local_b8;
    pRVar3 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    (pRVar3->key).baseType = (undefined2)local_b8;
    (pRVar3->key).listDepth = local_b8._2_1_;
    (pRVar3->key).isImplicitParam = (bool)local_b8._3_1_;
    *(undefined4 *)&(pRVar3->key).field_3 = local_b8._4_4_;
    *(undefined4 *)&(pRVar3->key).field_4 = SStack_b0.raw._0_4_;
    *(undefined4 *)((long)&(pRVar3->key).field_4 + 4) = SStack_b0.raw._4_4_;
    (pRVar3->value).ptr.disposer = local_a8;
    (pRVar3->value).ptr.ptr = pAStack_a0;
    pAStack_a0 = (AnnotatedHandler *)0x0;
    pEVar11 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    (pIVar1->annotatedHandlers).table.rows.builder.pos = pEVar11 + 1;
    local_b8 = pDVar7;
  }
  else {
    pAStack_a0 = (AnnotatedHandler *)0x0;
    if ((this_00->table).rows.builder.ptr[(long)unaff_R15].value.ptr.ptr == (AnnotatedHandler *)0x0)
    {
      Schema::getProto(&local_68,(Schema *)&local_98);
      local_78 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_68);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],capnp::Text::Reader>
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x591,FAILED,"existing != nullptr",
                 "\"cyclic JSON flattening detected\", schema.getProto().getDisplayName()",
                 (char (*) [32])"cyclic JSON flattening detected",(Reader *)&local_78);
      kj::_::Debug::Fault::fatal(&local_90);
    }
    if (pAVar5 != (AnnotatedHandler *)0x0) {
      (**local_a8->_vptr_Disposer)
                (local_a8,(_func_int *)
                          ((long)&(pAVar5->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                                  super_HandlerBase._vptr_HandlerBase +
                          (long)(pAVar5->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                                super_HandlerBase._vptr_HandlerBase[-2]),MVar12.ptr.field_1.value);
    }
    pEVar11 = (this_00->table).rows.builder.ptr + (long)unaff_R15;
  }
  pAVar5 = pAStack_a0;
  if (pAStack_a0 != (AnnotatedHandler *)0x0) {
    pAStack_a0 = (AnnotatedHandler *)0x0;
    (**local_a8->_vptr_Disposer)(local_a8,(long)pAVar5 + *(long *)(*(long *)pAVar5 + -0x10));
  }
  if ((pEVar11->value).ptr.ptr == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&local_b8,this,(StructSchema *)&local_98,discriminator,local_88,local_80);
    handler.raw = SStack_b0.raw;
    pDVar7 = local_b8;
    SStack_b0.raw = (RawBrandedSchema *)0x0;
    MVar9 = kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
            find<capnp::StructSchema&>
                      ((HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>
                        *)&((this->impl).ptr)->annotatedHandlers,(StructSchema *)&local_98);
    if (MVar9.ptr == (Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)0x0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_78.size_;
      local_78 = (ArrayPtr<const_char>)(auVar6 << 0x40);
      local_68._reader.segment = (SegmentReader *)0x0;
      local_68._reader.capTable = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_78,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_78);
    }
    pDVar4 = ((MVar9.ptr)->ptr).disposer;
    pAVar5 = ((MVar9.ptr)->ptr).ptr;
    ((MVar9.ptr)->ptr).disposer = pDVar7;
    ((MVar9.ptr)->ptr).ptr = (AnnotatedHandler *)handler.raw;
    if (pAVar5 != (AnnotatedHandler *)0x0) {
      (**pDVar4->_vptr_Disposer)
                (pDVar4,(_func_int *)
                        ((long)&(pAVar5->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                                super_HandlerBase._vptr_HandlerBase +
                        (long)(pAVar5->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                              super_HandlerBase._vptr_HandlerBase[-2]));
    }
    type.field_4.schema = local_98.schema;
    type.baseType = STRUCT;
    type.listDepth = '\0';
    type.isImplicitParam = false;
    type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    type._6_2_ = 0;
    addTypeHandlerImpl(this,type,(HandlerBase *)handler.raw);
    SVar8.raw = SStack_b0.raw;
    if (SStack_b0.raw != (RawBrandedSchema *)0x0) {
      SStack_b0.raw = (RawBrandedSchema *)0x0;
      (**local_b8->_vptr_Disposer)(local_b8,(long)SVar8.raw + *(long *)(*(long *)SVar8.raw + -0x10))
      ;
    }
  }
  else {
    handler.raw = (RawBrandedSchema *)(pEVar11->value).ptr.ptr;
  }
  return (AnnotatedHandler *)handler.raw;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, nullptr,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != nullptr,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_MAYBE(v, entry.value) {
    // Already exists.
    return **v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }